

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenAtomicCmpxchgSetReplacement
               (BinaryenExpressionRef expr,BinaryenExpressionRef replacementExpr)

{
  if (expr->_id != AtomicCmpxchgId) {
    __assert_fail("expression->is<AtomicCmpxchg>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xbed,
                  "void BinaryenAtomicCmpxchgSetReplacement(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (replacementExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 3) = replacementExpr;
    return;
  }
  __assert_fail("replacementExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xbee,
                "void BinaryenAtomicCmpxchgSetReplacement(BinaryenExpressionRef, BinaryenExpressionRef)"
               );
}

Assistant:

void BinaryenAtomicCmpxchgSetReplacement(
  BinaryenExpressionRef expr, BinaryenExpressionRef replacementExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<AtomicCmpxchg>());
  assert(replacementExpr);
  static_cast<AtomicCmpxchg*>(expression)->replacement =
    (Expression*)replacementExpr;
}